

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deep.cpp
# Opt level: O3

void anon_unknown.dwarf_44b42::generateRandomTileFile
               (string *filename,int channelCount,Compression compression)

{
  PixelType PVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  char cVar4;
  ushort uVar5;
  int iVar6;
  Array2D<void_*> *pAVar7;
  result_type rVar8;
  result_type rVar9;
  int iVar10;
  float fVar11;
  ostream *poVar12;
  long *plVar13;
  string *psVar14;
  ulong uVar15;
  void *pvVar16;
  void *pvVar17;
  ulong uVar18;
  ulong *puVar19;
  void *pvVar20;
  int *piVar21;
  ushort uVar22;
  int iVar23;
  uint uVar24;
  ushort uVar25;
  int i;
  ulong uVar26;
  int iVar27;
  PixelType PVar28;
  long lVar29;
  uint uVar30;
  ulong uVar31;
  long lVar32;
  int j_1;
  int iVar33;
  long lVar34;
  ulong *puVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  float fVar39;
  long local_2f0;
  long local_2e8;
  int j;
  Array<Imf_3_4::Array2D<void_*>_> data;
  DeepTiledOutputFile file;
  int type;
  int iStack_294;
  long local_288 [2];
  default_random_engine generator;
  Box2i box;
  DeepFrameBuffer frameBuffer;
  stringstream ss;
  int iStack_1b4;
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  generating deep tiled file \'",0x1e);
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(filename->_M_dataplus)._M_p,filename->_M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\' compression ",0xe);
  plVar13 = (long *)std::ostream::operator<<(poVar12,compression);
  std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
  std::ostream::put((char)plVar13);
  std::ostream::flush();
  frameBuffer._map._M_t._M_impl._0_8_ = 0;
  Imf_3_4::Header::Header
            ((Header *)&ss,(Box *)(anonymous_namespace)::displayWindow,
             (Box *)&(anonymous_namespace)::dataWindow,1.0,(Vec2 *)&frameBuffer,1.0,INCREASING_Y,
             compression);
  Imf_3_4::Header::operator=((Header *)(anonymous_namespace)::header,(Header *)&ss);
  Imf_3_4::Header::~Header((Header *)&ss);
  generator._M_x = 1;
  if (DAT_00361a18._M_current != (anonymous_namespace)::channelTypes) {
    DAT_00361a18._M_current = (anonymous_namespace)::channelTypes;
  }
  if (0 < channelCount) {
    iVar27 = 0;
    do {
      _ss = 0x200000000;
      rVar8 = std::uniform_int_distribution<int>::operator()
                        ((uniform_int_distribution<int> *)&ss,&generator,(param_type *)&ss);
      type = rVar8;
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::ostream::operator<<(local_1a8,iVar27);
      std::__cxx11::stringbuf::str();
      if (type == 0) {
        psVar14 = (string *)Imf_3_4::Header::channels();
        Imf_3_4::Channel::Channel((Channel *)&box,UINT,1,1,false);
        Imf_3_4::ChannelList::insert(psVar14,(Channel *)&frameBuffer);
      }
      iVar10 = type;
      if (type == 1) {
        psVar14 = (string *)Imf_3_4::Header::channels();
        Imf_3_4::Channel::Channel((Channel *)&box,HALF,1,1,false);
        Imf_3_4::ChannelList::insert(psVar14,(Channel *)&frameBuffer);
        iVar10 = type;
      }
      if (iVar10 == 2) {
        psVar14 = (string *)Imf_3_4::Header::channels();
        Imf_3_4::Channel::Channel((Channel *)&box,FLOAT,1,1,false);
        Imf_3_4::ChannelList::insert(psVar14,(Channel *)&frameBuffer);
      }
      if (DAT_00361a18._M_current == DAT_00361a20) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&(anonymous_namespace)::channelTypes,
                   DAT_00361a18,&type);
      }
      else {
        *DAT_00361a18._M_current = type;
        DAT_00361a18._M_current = DAT_00361a18._M_current + 1;
      }
      if ((_Base_ptr *)frameBuffer._map._M_t._M_impl._0_8_ !=
          &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)frameBuffer._map._M_t._M_impl._0_8_,
                        (ulong)((long)&(frameBuffer._map._M_t._M_impl.super__Rb_tree_header.
                                        _M_header._M_parent)->_M_color + 1));
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::ios_base::~ios_base(local_138);
      iVar27 = iVar27 + 1;
    } while (channelCount != iVar27);
  }
  Imf_3_4::Header::setType((string *)(anonymous_namespace)::header);
  _ss = 0x11000000000;
  rVar8 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&ss,&generator,(param_type *)&ss);
  _ss = 0xa800000000;
  rVar9 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&ss,&generator,(param_type *)&ss);
  _ss = CONCAT44(rVar9 + 1,rVar8 + 1);
  Imf_3_4::Header::setTileDescription((TileDescription *)(anonymous_namespace)::header);
  remove((filename->_M_dataplus)._M_p);
  Imf_3_4::DeepTiledOutputFile::DeepTiledOutputFile
            (&file,(filename->_M_dataplus)._M_p,(Header *)(anonymous_namespace)::header,8);
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Imf_3_4::Slice::Slice(&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,false,false);
  Imf_3_4::Array<Imf_3_4::Array2D<void_*>_>::Array(&data,(long)channelCount);
  uVar15 = (ulong)(uint)channelCount;
  if (0 < channelCount) {
    lVar37 = 0;
    do {
      pAVar7 = data._data;
      pvVar16 = operator_new__(0x5a1c8);
      pvVar17 = *(void **)((long)&pAVar7->_data + lVar37);
      if (pvVar17 != (void *)0x0) {
        operator_delete__(pvVar17);
      }
      *(undefined8 *)((long)&pAVar7->_sizeX + lVar37) = 0xa9;
      *(undefined8 *)((long)&pAVar7->_sizeY + lVar37) = 0x111;
      *(void **)((long)&pAVar7->_data + lVar37) = pvVar16;
      lVar37 = lVar37 + 0x18;
    } while (uVar15 * 0x18 != lVar37);
  }
  pvVar17 = operator_new__(0x2d0e4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   tileSizeX ",0xd);
  Imf_3_4::DeepTiledOutputFile::tileXSize();
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"   tileSizeY ",0xd);
  Imf_3_4::DeepTiledOutputFile::tileYSize();
  poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
  std::ostream::put((char)poVar12);
  std::ostream::flush();
  iVar27 = Imf_3_4::DeepTiledOutputFile::numYLevels();
  iVar10 = Imf_3_4::DeepTiledOutputFile::numXLevels();
  lVar37 = (long)iVar27;
  lVar32 = (long)iVar10;
  uVar26 = lVar32 * lVar37;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar26;
  uVar18 = SUB168(auVar3 * ZEXT816(0x18),0);
  uVar31 = uVar18 + 8;
  if (0xfffffffffffffff7 < uVar18) {
    uVar31 = 0xffffffffffffffff;
  }
  if (SUB168(auVar3 * ZEXT816(0x18),8) != 0) {
    uVar31 = 0xffffffffffffffff;
  }
  puVar19 = (ulong *)operator_new__(uVar31);
  *puVar19 = uVar26;
  puVar19 = puVar19 + 1;
  if (uVar26 != 0) {
    memset(puVar19,0,((uVar18 - 0x18) / 0x18) * 0x18 + 0x18);
  }
  if (DAT_00361a50 != (ulong *)0x0) {
    lVar36 = *(long *)((long)DAT_00361a50 + -8);
    pvVar16 = (void *)((long)DAT_00361a50 + -8);
    if (lVar36 != 0) {
      lVar34 = lVar36 * 0x18;
      do {
        pvVar20 = *(void **)((long)pvVar16 + lVar34);
        if (pvVar20 != (void *)0x0) {
          operator_delete__(pvVar20);
        }
        lVar34 = lVar34 + -0x18;
      } while (lVar34 != 0);
    }
    operator_delete__(pvVar16,lVar36 * 0x18 + 8);
  }
  (anonymous_namespace)::sampleCountTiles = lVar37;
  DAT_00361a48 = lVar32;
  DAT_00361a50 = puVar19;
  if (0 < iVar27) {
    local_2e8 = 0;
    lVar34 = 0;
    lVar36 = lVar32;
    do {
      if (0 < lVar32) {
        lVar29 = 0x10;
        lVar38 = 0;
        puVar35 = puVar19;
        do {
          pvVar20 = operator_new__(0x2d0e4);
          lVar37 = lVar32 * local_2e8;
          pvVar16 = *(void **)((long)puVar35 + lVar29 + lVar37);
          lVar32 = lVar36;
          puVar19 = puVar35;
          if (pvVar16 != (void *)0x0) {
            operator_delete__(pvVar16);
            lVar32 = DAT_00361a48;
            puVar19 = DAT_00361a50;
          }
          *(undefined8 *)((long)puVar35 + lVar29 + lVar37 + -0x10) = 0xa9;
          *(undefined8 *)((long)puVar35 + lVar29 + -8 + lVar37) = 0x111;
          *(void **)((long)puVar35 + lVar29 + lVar37) = pvVar20;
          lVar38 = lVar38 + 1;
          lVar29 = lVar29 + 0x18;
          lVar37 = (anonymous_namespace)::sampleCountTiles;
          lVar36 = lVar32;
          puVar35 = puVar19;
        } while (lVar38 < lVar32);
      }
      lVar34 = lVar34 + 1;
      local_2e8 = local_2e8 + 0x18;
    } while (lVar34 < lVar37);
  }
  lVar37 = (long)DAT_003619f4 * 0x111 + (long)(anonymous_namespace)::dataWindow;
  Imf_3_4::Slice::Slice
            ((Slice *)&ss,UINT,(char *)((long)pvVar17 + lVar37 * -4),4,0x444,1,1,0.0,false,false);
  Imf_3_4::DeepFrameBuffer::insertSampleCountSlice((Slice *)&frameBuffer);
  if (0 < channelCount) {
    lVar32 = 0x10;
    uVar18 = 0;
    do {
      PVar1 = (anonymous_namespace)::channelTypes[uVar18];
      PVar28 = (uint)(PVar1 != UINT) * 3;
      if (PVar1 == HALF) {
        PVar28 = PVar1;
      }
      if (PVar1 == FLOAT) {
        PVar28 = PVar1;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::ostream::operator<<(local_1a8,(int)uVar18);
      std::__cxx11::stringbuf::str();
      iVar27 = (anonymous_namespace)::channelTypes[uVar18];
      uVar26 = (ulong)(iVar27 == 0) << 2;
      if (iVar27 == 1) {
        uVar26 = 2;
      }
      if (iVar27 == 2) {
        uVar26 = 4;
      }
      Imf_3_4::DeepSlice::DeepSlice
                ((DeepSlice *)&box,PVar28,
                 (char *)(*(long *)((long)&(data._data)->_sizeX + lVar32) + lVar37 * -8),8,0x888,
                 uVar26,1,1,0.0,false,false);
      Imf_3_4::DeepFrameBuffer::insert((string *)&frameBuffer,(DeepSlice *)&type);
      if (_type != (param_type)local_288) {
        operator_delete((void *)_type,local_288[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::ios_base::~ios_base(local_138);
      uVar18 = uVar18 + 1;
      lVar32 = lVar32 + 0x18;
    } while (uVar15 != uVar18);
  }
  Imf_3_4::DeepTiledOutputFile::setFrameBuffer((DeepFrameBuffer *)&file);
  local_2f0 = 0;
  do {
    iVar27 = Imf_3_4::DeepTiledOutputFile::numYLevels();
    if (iVar27 <= local_2f0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   --> done",0xb);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      operator_delete__(pvVar17);
      Imf_3_4::Array<Imf_3_4::Array2D<void_*>_>::~Array(&data);
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::DeepSlice>_>_>
                   *)&frameBuffer);
      Imf_3_4::DeepTiledOutputFile::~DeepTiledOutputFile(&file);
      return;
    }
    lVar37 = 0;
    while( true ) {
      iVar27 = Imf_3_4::DeepTiledOutputFile::numXLevels();
      if (iVar27 <= lVar37) break;
      Imf_3_4::DeepTiledOutputFile::dataWindowForLevel((int)&ss,(int)&file);
      j = 0;
      while( true ) {
        iVar10 = (int)&file;
        iVar27 = Imf_3_4::DeepTiledOutputFile::numYTiles(iVar10);
        if (iVar27 <= j) break;
        iVar27 = 0;
        while( true ) {
          iVar10 = Imf_3_4::DeepTiledOutputFile::numXTiles((int)&file);
          if (iVar10 <= iVar27) break;
          Imf_3_4::DeepTiledOutputFile::dataWindowForTile((int)&box,(int)&file,iVar27,j);
          iVar33 = box.max.x;
          iVar23 = box.max.y;
          iVar10 = box.min.y;
          if (box.min.y <= box.max.y) {
            do {
              iVar6 = box.min.x;
              if (box.min.x <= iVar33) {
                do {
                  lVar36 = (long)iStack_1b4;
                  lVar32 = (long)_ss;
                  type = 0;
                  iStack_294 = 9;
                  rVar8 = std::uniform_int_distribution<int>::operator()
                                    ((uniform_int_distribution<int> *)&type,&generator,
                                     (param_type *)&type);
                  lVar36 = iVar10 - lVar36;
                  lVar32 = iVar6 - lVar32;
                  *(result_type *)((long)pvVar17 + lVar32 * 4 + lVar36 * 0x444) = rVar8 + 1;
                  *(result_type *)
                   (DAT_00361a50[DAT_00361a48 * local_2f0 * 3 + lVar37 * 3 + 1] * lVar36 * 4 +
                    DAT_00361a50[DAT_00361a48 * local_2f0 * 3 + lVar37 * 3 + 2] + lVar32 * 4) =
                       rVar8 + 1;
                  if (0 < channelCount) {
                    iVar33 = ((int)lVar36 * 0x111 + (int)lVar32) % 0x801;
                    fVar39 = (float)iVar33;
                    uVar30 = (uint)fVar39 & 0x7fffff | 0x800000;
                    cVar4 = (char)((uint)fVar39 >> 0x17);
                    fVar11 = ABS(fVar39);
                    uVar22 = (ushort)((uint)fVar39 >> 0x10) & 0x8000;
                    uVar24 = (uint)fVar39 >> 0xd & 0x3ff;
                    uVar25 = uVar22 + 0x7c00;
                    if ((uint)fVar11 < 0x477ff000) {
                      uVar25 = (ushort)((int)fVar11 + 0x8000fff +
                                        (uint)(((uint)fVar11 >> 0xd & 1) != 0) >> 0xd) | uVar22;
                    }
                    uVar5 = (ushort)(uVar24 == 0) | (ushort)uVar24;
                    if (fVar11 == INFINITY) {
                      uVar5 = 0;
                    }
                    uVar5 = uVar22 + 0x7c00 + uVar5;
                    if ((uint)fVar11 < 0x7f800000) {
                      uVar5 = uVar25;
                    }
                    uVar25 = (ushort)(0x80000000 < uVar30 << (cVar4 + 0xa2U & 0x1f)) +
                             ((ushort)(uVar30 >> (0x7eU - cVar4 & 0x1f)) | uVar22);
                    if ((uint)fVar11 < 0x33000001) {
                      uVar25 = uVar22;
                    }
                    uVar18 = (ulong)*(uint *)((long)pvVar17 + lVar32 * 4 + lVar36 * 0x444);
                    if (0x387fffff < (uint)fVar11) {
                      uVar25 = uVar5;
                    }
                    uVar26 = 0;
                    piVar21 = (anonymous_namespace)::channelTypes;
                    do {
                      iVar23 = piVar21[uVar26];
                      if (iVar23 == 0) {
                        pvVar16 = operator_new__(uVar18 << 2);
                        data._data[uVar26]._data[data._data[uVar26]._sizeY * lVar36 + lVar32] =
                             pvVar16;
                        iVar23 = (anonymous_namespace)::channelTypes[uVar26];
                        piVar21 = (anonymous_namespace)::channelTypes;
                      }
                      if (iVar23 == 1) {
                        pvVar16 = operator_new__(uVar18 * 2);
                        data._data[uVar26]._data[data._data[uVar26]._sizeY * lVar36 + lVar32] =
                             pvVar16;
                        iVar23 = (anonymous_namespace)::channelTypes[uVar26];
                        piVar21 = (anonymous_namespace)::channelTypes;
                      }
                      if (iVar23 == 2) {
                        pvVar16 = operator_new__(uVar18 << 2);
                        data._data[uVar26]._data[data._data[uVar26]._sizeY * lVar36 + lVar32] =
                             pvVar16;
                        piVar21 = (anonymous_namespace)::channelTypes;
                      }
                      if ((int)uVar18 == 0) {
                        uVar18 = 0;
                      }
                      else {
                        iVar23 = piVar21[uVar26];
                        uVar31 = 0;
                        do {
                          if (iVar23 == 0) {
                            *(int *)((long)data._data[uVar26]._data
                                           [data._data[uVar26]._sizeY * lVar36 + lVar32] +
                                    uVar31 * 4) = iVar33;
                            iVar23 = piVar21[uVar26];
                          }
                          if (iVar23 == 2) {
                            *(float *)((long)data._data[uVar26]._data
                                             [data._data[uVar26]._sizeY * lVar36 + lVar32] +
                                      uVar31 * 4) = fVar39;
                          }
                          else if (iVar23 == 1) {
                            *(ushort *)
                             ((long)data._data[uVar26]._data
                                    [data._data[uVar26]._sizeY * lVar36 + lVar32] + uVar31 * 2) =
                                 uVar25;
                          }
                          uVar31 = uVar31 + 1;
                          uVar18 = (ulong)*(uint *)((long)pvVar17 + lVar32 * 4 + lVar36 * 0x444);
                        } while (uVar31 < uVar18);
                      }
                      uVar26 = uVar26 + 1;
                    } while (uVar26 != uVar15);
                  }
                  bVar2 = iVar6 < box.max.x;
                  iVar33 = box.max.x;
                  iVar6 = iVar6 + 1;
                  iVar23 = box.max.y;
                } while (bVar2);
              }
              bVar2 = iVar10 < iVar23;
              iVar10 = iVar10 + 1;
            } while (bVar2);
          }
          iVar27 = iVar27 + 1;
        }
        j = j + 1;
      }
      iVar27 = Imf_3_4::DeepTiledOutputFile::numXTiles(iVar10);
      iVar33 = Imf_3_4::DeepTiledOutputFile::numYTiles(iVar10);
      Imf_3_4::DeepTiledOutputFile::writeTiles(iVar10,0,iVar27 + -1,0,iVar33 + -1,(int)lVar37);
      for (lVar32 = 0; iVar27 = Imf_3_4::DeepTiledOutputFile::levelHeight((int)&file),
          lVar32 < iVar27; lVar32 = lVar32 + 1) {
        for (lVar36 = 0; iVar27 = Imf_3_4::DeepTiledOutputFile::levelWidth((int)&file),
            lVar36 < iVar27; lVar36 = lVar36 + 1) {
          if (0 < channelCount) {
            lVar34 = 4;
            uVar18 = 0;
            piVar21 = (anonymous_namespace)::channelTypes;
            do {
              iVar27 = piVar21[uVar18];
              if (iVar27 == 0) {
                pvVar16 = *(void **)(*(long *)((long)data._data + lVar34 * 4 + -8) * lVar32 * 8 +
                                     *(long *)((long)&(data._data)->_sizeX + lVar34 * 4) +
                                    lVar36 * 8);
                if (pvVar16 != (void *)0x0) {
                  operator_delete__(pvVar16);
                  iVar27 = (anonymous_namespace)::channelTypes[uVar18];
                  piVar21 = (anonymous_namespace)::channelTypes;
                  goto LAB_0011d8cd;
                }
              }
              else {
LAB_0011d8cd:
                if (iVar27 == 1) {
                  pvVar16 = *(void **)(*(long *)((long)data._data + lVar34 * 4 + -8) * lVar32 * 8 +
                                       *(long *)((long)&(data._data)->_sizeX + lVar34 * 4) +
                                      lVar36 * 8);
                  if (pvVar16 == (void *)0x0) goto LAB_0011d931;
                  operator_delete__(pvVar16);
                  iVar27 = (anonymous_namespace)::channelTypes[uVar18];
                  piVar21 = (anonymous_namespace)::channelTypes;
                }
                if ((iVar27 == 2) &&
                   (pvVar16 = *(void **)(*(long *)((long)data._data + lVar34 * 4 + -8) * lVar32 * 8
                                         + *(long *)((long)&(data._data)->_sizeX + lVar34 * 4) +
                                        lVar36 * 8), pvVar16 != (void *)0x0)) {
                  operator_delete__(pvVar16);
                  piVar21 = (anonymous_namespace)::channelTypes;
                }
              }
LAB_0011d931:
              uVar18 = uVar18 + 1;
              lVar34 = lVar34 + 6;
            } while (uVar15 != uVar18);
          }
        }
      }
      lVar37 = lVar37 + 1;
    }
    local_2f0 = local_2f0 + 1;
  } while( true );
}

Assistant:

void
generateRandomTileFile (
    const std::string& filename, int channelCount, Compression compression)
{
    std::cout << "  generating deep tiled file '" << filename
              << "' compression " << compression << std::endl;
    header = Header (
        displayWindow,
        dataWindow,
        1,
        IMATH_NAMESPACE::V2f (0, 0),
        1,
        INCREASING_Y,
        compression);

    constexpr bool             relativeCoords = false;
    std::default_random_engine generator;
    auto                       generate_random_int = [&] (int range) -> int {
        std::uniform_int_distribution<int> distribution (0, range - 1);
        return distribution (generator);
    };
    //
    // Add channels.
    //

    channelTypes.clear ();

    for (int i = 0; i < channelCount; i++)
    {
        int               type = generate_random_int (3);
        std::stringstream ss;
        ss << i;
        std::string str = ss.str ();
        if (type == 0) header.channels ().insert (str, Channel (IMF::UINT));
        if (type == 1) header.channels ().insert (str, Channel (IMF::HALF));
        if (type == 2) header.channels ().insert (str, Channel (IMF::FLOAT));
        channelTypes.push_back (type);
    }

    header.setType (DEEPTILE);
    header.setTileDescription (TileDescription (
        generate_random_int (width) + 1,
        generate_random_int (height) + 1,
        RIPMAP_LEVELS));

    //
    // Set up the output file
    //
    remove (filename.c_str ());
    DeepTiledOutputFile file (filename.c_str (), header, 8);

    DeepFrameBuffer frameBuffer;

    Array<Array2D<void*>> data (channelCount);
    for (int i = 0; i < channelCount; i++)
        data[i].resizeErase (height, width);

    Array2D<unsigned int> sampleCount;
    sampleCount.resizeErase (height, width);

    std::cout << "   tileSizeX " << file.tileXSize () << "   tileSizeY "
              << file.tileYSize () << std::endl;

    sampleCountTiles.resizeErase (file.numYLevels (), file.numXLevels ());
    for (int i = 0; i < sampleCountTiles.height (); i++)
        for (int j = 0; j < sampleCountTiles.width (); j++)
            sampleCountTiles[i][j].resizeErase (height, width);

    int memOffset;
    if (relativeCoords)
        memOffset = 0;
    else
        memOffset = dataWindow.min.x + dataWindow.min.y * width;

    frameBuffer.insertSampleCountSlice (Slice (
        IMF::UINT,
        (char*) (&sampleCount[0][0] - memOffset),
        sizeof (unsigned int) * 1,
        sizeof (unsigned int) * width,
        1,
        1,
        0,
        relativeCoords,
        relativeCoords));

    for (int i = 0; i < channelCount; i++)
    {
        PixelType type = NUM_PIXELTYPES;
        if (channelTypes[i] == 0) type = IMF::UINT;
        if (channelTypes[i] == 1) type = IMF::HALF;
        if (channelTypes[i] == 2) type = IMF::FLOAT;

        std::stringstream ss;
        ss << i;
        std::string str = ss.str ();

        int sampleSize = 0;
        if (channelTypes[i] == 0) sampleSize = sizeof (unsigned int);
        if (channelTypes[i] == 1) sampleSize = sizeof (half);
        if (channelTypes[i] == 2) sampleSize = sizeof (float);

        int pointerSize = sizeof (char*);

        frameBuffer.insert (
            str,
            DeepSlice (
                type,
                (char*) (&data[i][0][0] - memOffset),
                pointerSize * 1,
                pointerSize * width,
                sampleSize,
                1,
                1,
                0,
                relativeCoords,
                relativeCoords));
    }

    file.setFrameBuffer (frameBuffer);

    for (int ly = 0; ly < file.numYLevels (); ly++)
        for (int lx = 0; lx < file.numXLevels (); lx++)
        {
            Box2i dataWindowL = file.dataWindowForLevel (lx, ly);

            for (int j = 0; j < file.numYTiles (ly); j++)
            {
                for (int i = 0; i < file.numXTiles (lx); i++)
                {
                    Box2i box = file.dataWindowForTile (i, j, lx, ly);
                    for (int y = box.min.y; y <= box.max.y; y++)
                        for (int x = box.min.x; x <= box.max.x; x++)
                        {
                            int dwy = y - dataWindowL.min.y;
                            int dwx = x - dataWindowL.min.x;
                            sampleCount[dwy][dwx] =
                                generate_random_int (10) + 1;
                            sampleCountTiles[ly][lx][dwy][dwx] =
                                sampleCount[dwy][dwx];
                            for (int k = 0; k < channelCount; k++)
                            {
                                if (channelTypes[k] == 0)
                                    data[k][dwy][dwx] =
                                        new unsigned int[sampleCount[dwy][dwx]];
                                if (channelTypes[k] == 1)
                                    data[k][dwy][dwx] =
                                        new half[sampleCount[dwy][dwx]];
                                if (channelTypes[k] == 2)
                                    data[k][dwy][dwx] =
                                        new float[sampleCount[dwy][dwx]];
                                for (unsigned int l = 0;
                                     l < sampleCount[dwy][dwx];
                                     l++)
                                {
                                    if (channelTypes[k] == 0)
                                        ((unsigned int*) data[k][dwy][dwx])[l] =
                                            (dwy * width + dwx) % 2049;
                                    if (channelTypes[k] == 1)
                                        ((half*) data[k][dwy][dwx])[l] =
                                            (dwy * width + dwx) % 2049;
                                    if (channelTypes[k] == 2)
                                        ((float*) data[k][dwy][dwx])[l] =
                                            (dwy * width + dwx) % 2049;
                                }
                            }
                        }
                }
            }

            file.writeTiles (
                0, file.numXTiles (lx) - 1, 0, file.numYTiles (ly) - 1, lx, ly);

            for (int i = 0; i < file.levelHeight (ly); i++)
                for (int j = 0; j < file.levelWidth (lx); j++)
                    for (int k = 0; k < channelCount; k++)
                    {
                        if (channelTypes[k] == 0)
                            delete[] (unsigned int*) data[k][i][j];
                        if (channelTypes[k] == 1)
                            delete[] (half*) data[k][i][j];
                        if (channelTypes[k] == 2)
                            delete[] (float*) data[k][i][j];
                    }
        }
    std::cout << "   --> done" << std::endl;
}